

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

void Acb_ObjMarkTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,Vec_Int_t *vMarked)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  if ((-1 < iObj) && (iObj < (p->vObjTrav).nSize)) {
    piVar3 = (p->vObjTrav).pArray;
    iVar1 = p->nObjTravs;
    iVar2 = piVar3[(uint)iObj];
    piVar3[(uint)iObj] = iVar1;
    if (iVar2 != iVar1) {
      Vec_IntPush(vMarked,iObj);
      if (iObj == 0) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x113,"int Acb_ObjLevelD(Acb_Ntk_t *, int)");
      }
      if ((p->vLevelD).nSize <= iObj) goto LAB_0039fd62;
      if ((p->vLevelD).pArray[(uint)iObj] <= nTfoLevMax) {
        if (iObj < (p->vFanouts).nSize) {
          if (nFanMax < (p->vFanouts).pArray[(uint)iObj].nSize) {
            return;
          }
          if (iObj < (p->vFanouts).nSize) {
            lVar5 = 0;
            do {
              pVVar4 = (p->vFanouts).pArray;
              if (pVVar4[(uint)iObj].nSize <= lVar5) {
                return;
              }
              iVar1 = pVVar4[(uint)iObj].pArray[lVar5];
              if ((long)iVar1 < 1) {
                __assert_fail("i>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                              ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
              }
              if ((p->vObjType).nSize <= iVar1) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                              ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
              }
              if ((p->vObjType).pArray[iVar1] != '\0') {
                Acb_ObjMarkTfo_rec(p,iVar1,nTfoLevMax,nFanMax,vMarked);
              }
              lVar5 = lVar5 + 1;
            } while (iObj < (p->vFanouts).nSize);
          }
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
    }
    return;
  }
LAB_0039fd62:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_ObjMarkTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, Vec_Int_t * vMarked )
{
    int iFanout, i;
    if ( Acb_ObjSetTravIdCur(p, iObj) )
        return;
    Vec_IntPush( vMarked, iObj );
    if ( Acb_ObjLevelD(p, iObj) > nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
        return;
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        Acb_ObjMarkTfo_rec( p, iFanout, nTfoLevMax, nFanMax, vMarked );
}